

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppu_widget.cpp
# Opt level: O0

void __thiscall nesvis::PpuWidget::draw(PpuWidget *this)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  unsigned_short uVar4;
  PpuRegisters *pPVar5;
  undefined8 local_2e;
  PpuRegisters reg;
  PpuWidget *this_local;
  
  reg._22_8_ = this;
  ImGui::Begin("Nes ppu",(bool *)0x0,0);
  pPVar5 = n_e_s::nes::Nes::ppu_registers(this->nes_);
  local_2e._0_2_ = pPVar5->scanline;
  local_2e._2_2_ = pPVar5->cycle;
  local_2e._4_1_ = pPVar5->ctrl;
  local_2e._5_1_ = pPVar5->mask;
  local_2e._6_1_ = pPVar5->status;
  local_2e._7_1_ = pPVar5->oamaddr;
  reg._0_8_ = *(undefined8 *)&pPVar5->fine_x_scroll;
  reg._8_8_ = *(undefined8 *)&pPVar5->name_table_latch;
  reg._16_4_ = *(undefined4 *)&pPVar5->attribute_table_latch;
  reg.pattern_table_shifter_low = pPVar5->attribute_table_shifter_hi;
  bVar1 = n_e_s::core::Register<unsigned_char>::value
                    ((Register<unsigned_char> *)((long)&local_2e + 4));
  ImGui::Text("%s: %02hhX","ctrl",(ulong)bVar1);
  bVar2 = ImGui::IsItemHovered(0);
  if (bVar2) {
    ImGui::BeginTooltip();
    ImGui::Text("Ctrl: 0x2000");
    bVar2 = n_e_s::core::Register<unsigned_char>::is_set
                      ((Register<unsigned_char> *)((long)&local_2e + 4),0);
    bVar3 = n_e_s::core::Register<unsigned_char>::is_set
                      ((Register<unsigned_char> *)((long)&local_2e + 4),1);
    ImGui::Text("Nametable address: %d:%d",(ulong)bVar2,(ulong)bVar3);
    bVar2 = n_e_s::core::Register<unsigned_char>::is_set
                      ((Register<unsigned_char> *)((long)&local_2e + 4),2);
    ImGui::Text("Vram increment: %d",(ulong)bVar2);
    bVar2 = n_e_s::core::Register<unsigned_char>::is_set
                      ((Register<unsigned_char> *)((long)&local_2e + 4),3);
    ImGui::Text("Sprite pattern table address: %d",(ulong)bVar2);
    bVar2 = n_e_s::core::Register<unsigned_char>::is_set
                      ((Register<unsigned_char> *)((long)&local_2e + 4),4);
    ImGui::Text("Background pattern table address: %d",(ulong)bVar2);
    bVar2 = n_e_s::core::Register<unsigned_char>::is_set
                      ((Register<unsigned_char> *)((long)&local_2e + 4),5);
    ImGui::Text("Sprite size: %d",(ulong)bVar2);
    bVar2 = n_e_s::core::Register<unsigned_char>::is_set
                      ((Register<unsigned_char> *)((long)&local_2e + 4),6);
    ImGui::Text("Ppu master/slave select: %d",(ulong)bVar2);
    bVar2 = n_e_s::core::Register<unsigned_char>::is_set
                      ((Register<unsigned_char> *)((long)&local_2e + 4),7);
    ImGui::Text("Generate NMI: %d",(ulong)bVar2);
    ImGui::EndTooltip();
  }
  bVar1 = n_e_s::core::Register<unsigned_char>::value
                    ((Register<unsigned_char> *)((long)&local_2e + 5));
  ImGui::Text("%s: %02hhX","mask",(ulong)bVar1);
  bVar2 = ImGui::IsItemHovered(0);
  if (bVar2) {
    ImGui::BeginTooltip();
    ImGui::Text("Mask: 0x2001");
    bVar2 = n_e_s::core::Register<unsigned_char>::is_set
                      ((Register<unsigned_char> *)((long)&local_2e + 5),0);
    ImGui::Text("Greyscale: %d",(ulong)bVar2);
    bVar2 = n_e_s::core::Register<unsigned_char>::is_set
                      ((Register<unsigned_char> *)((long)&local_2e + 5),1);
    ImGui::Text("Show bkg left: %d",(ulong)bVar2);
    bVar2 = n_e_s::core::Register<unsigned_char>::is_set
                      ((Register<unsigned_char> *)((long)&local_2e + 5),2);
    ImGui::Text("Show sprites left: %d",(ulong)bVar2);
    bVar2 = n_e_s::core::Register<unsigned_char>::is_set
                      ((Register<unsigned_char> *)((long)&local_2e + 5),3);
    ImGui::Text("Show bkg: %d",(ulong)bVar2);
    bVar2 = n_e_s::core::Register<unsigned_char>::is_set
                      ((Register<unsigned_char> *)((long)&local_2e + 5),4);
    ImGui::Text("Show sprites: %d",(ulong)bVar2);
    ImGui::EndTooltip();
  }
  bVar1 = n_e_s::core::Register<unsigned_char>::value
                    ((Register<unsigned_char> *)((long)&local_2e + 6));
  ImGui::Text("%s: %02hhX","status",(ulong)bVar1);
  ImGui::Text("%s: %02hhX","oamaddr",local_2e >> 0x38);
  ImGui::Text("%s: %02hhX","scroll",reg._0_8_ & 0xff);
  uVar4 = n_e_s::core::Register<unsigned_short>::value((Register<unsigned_short> *)&reg.cycle);
  ImGui::Text("%s: %04hX","vram_addr",(ulong)uVar4);
  bVar2 = ImGui::CollapsingHeader("Pattern tables",0);
  if (bVar2) {
    draw_patterntables(this);
  }
  bVar2 = ImGui::CollapsingHeader("Nametables",0);
  if (bVar2) {
    draw_nametables(this);
  }
  bVar2 = ImGui::CollapsingHeader("Sprites",0);
  if (bVar2) {
    draw_sprites(this);
  }
  bVar2 = ImGui::CollapsingHeader("Palettes",0);
  if (bVar2) {
    draw_palettes(this);
  }
  ImGui::End();
  return;
}

Assistant:

void PpuWidget::draw() {
    ImGui::Begin("Nes ppu");

    const auto reg = nes_->ppu_registers();

    ImGui::Text("%s: %02hhX", "ctrl", reg.ctrl.value());
    if (ImGui::IsItemHovered()) {
        ImGui::BeginTooltip();
        ImGui::Text("Ctrl: 0x2000");
        ImGui::Text("Nametable address: %d:%d",
                reg.ctrl.is_set(0),
                reg.ctrl.is_set(1));
        ImGui::Text("Vram increment: %d", reg.ctrl.is_set(2));
        ImGui::Text("Sprite pattern table address: %d", reg.ctrl.is_set(3));
        ImGui::Text("Background pattern table address: %d", reg.ctrl.is_set(4));
        ImGui::Text("Sprite size: %d", reg.ctrl.is_set(5));
        ImGui::Text("Ppu master/slave select: %d", reg.ctrl.is_set(6));
        ImGui::Text("Generate NMI: %d", reg.ctrl.is_set(7));
        ImGui::EndTooltip();
    }

    ImGui::Text("%s: %02hhX", "mask", reg.mask.value());
    if (ImGui::IsItemHovered()) {
        ImGui::BeginTooltip();
        ImGui::Text("Mask: 0x2001");
        ImGui::Text("Greyscale: %d", reg.mask.is_set(0));
        ImGui::Text("Show bkg left: %d", reg.mask.is_set(1));
        ImGui::Text("Show sprites left: %d", reg.mask.is_set(2));
        ImGui::Text("Show bkg: %d", reg.mask.is_set(3));
        ImGui::Text("Show sprites: %d", reg.mask.is_set(4));
        ImGui::EndTooltip();
    }

    ImGui::Text("%s: %02hhX", "status", reg.status.value());

    ImGui::Text("%s: %02hhX", "oamaddr", reg.oamaddr);

    ImGui::Text("%s: %02hhX", "scroll", reg.fine_x_scroll);

    ImGui::Text("%s: %04hX", "vram_addr", reg.vram_addr.value());

    if (ImGui::CollapsingHeader("Pattern tables")) {
        draw_patterntables();
    }
    if (ImGui::CollapsingHeader("Nametables")) {
        draw_nametables();
    }
    if (ImGui::CollapsingHeader("Sprites")) {
        draw_sprites();
    }
    if (ImGui::CollapsingHeader("Palettes")) {
        draw_palettes();
    }

    ImGui::End(); // window
}